

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToCFFEmbeddedFontWriter.cpp
# Opt level: O0

EStatusCode __thiscall
Type1ToCFFEmbeddedFontWriter::WritePrivateDictionary(Type1ToCFFEmbeddedFontWriter *this)

{
  EStatusCode EVar1;
  LongFilePositionType LVar2;
  Type1ToCFFEmbeddedFontWriter *this_local;
  
  LVar2 = OutputStringBufferStream::GetCurrentPosition(&this->mFontFileStream);
  this->mPrivatePosition = LVar2;
  AddDeltaVectorIfNotEmpty
            (this,&this->mPrimitivesWriter,&(this->mType1Input).mPrivateDictionary.BlueValues,6);
  AddDeltaVectorIfNotEmpty
            (this,&this->mPrimitivesWriter,&(this->mType1Input).mPrivateDictionary.OtherBlues,7);
  AddDeltaVectorIfNotEmpty
            (this,&this->mPrimitivesWriter,&(this->mType1Input).mPrivateDictionary.FamilyBlues,8);
  AddDeltaVectorIfNotEmpty
            (this,&this->mPrimitivesWriter,&(this->mType1Input).mPrivateDictionary.FamilyOtherBlues,
             9);
  AddNumberOperandIfNotDefault
            (this,&this->mPrimitivesWriter,(this->mType1Input).mPrivateDictionary.BlueScale,0xc09,
             0.039625);
  AddNumberOperandIfNotDefault
            (this,&this->mPrimitivesWriter,(this->mType1Input).mPrivateDictionary.BlueShift,0xc0a,7)
  ;
  AddNumberOperandIfNotDefault
            (this,&this->mPrimitivesWriter,(this->mType1Input).mPrivateDictionary.BlueFuzz,0xc0b,1);
  CFFPrimitiveWriter::WriteRealOperand
            (&this->mPrimitivesWriter,(this->mType1Input).mPrivateDictionary.StdHW,10);
  CFFPrimitiveWriter::WriteDictOperator(&this->mPrimitivesWriter,10);
  CFFPrimitiveWriter::WriteRealOperand
            (&this->mPrimitivesWriter,(this->mType1Input).mPrivateDictionary.StdVW,10);
  CFFPrimitiveWriter::WriteDictOperator(&this->mPrimitivesWriter,0xb);
  AddDeltaVectorIfNotEmpty
            (this,&this->mPrimitivesWriter,&(this->mType1Input).mPrivateDictionary.StemSnapH,0xc0c);
  AddDeltaVectorIfNotEmpty
            (this,&this->mPrimitivesWriter,&(this->mType1Input).mPrivateDictionary.StemSnapV,0xc0d);
  AddNumberOperandIfNotDefault
            (this,&this->mPrimitivesWriter,
             (uint)(((this->mType1Input).mPrivateDictionary.ForceBold & 1U) != 0),0xc0e,0);
  AddNumberOperandIfNotDefault
            (this,&this->mPrimitivesWriter,(this->mType1Input).mPrivateDictionary.LanguageGroup,
             0xc11,0);
  LVar2 = OutputStringBufferStream::GetCurrentPosition(&this->mFontFileStream);
  this->mPrivateSize = LVar2 - this->mPrivatePosition;
  EVar1 = CFFPrimitiveWriter::GetInternalState(&this->mPrimitivesWriter);
  return EVar1;
}

Assistant:

EStatusCode Type1ToCFFEmbeddedFontWriter::WritePrivateDictionary()
{
	mPrivatePosition = mFontFileStream.GetCurrentPosition();

	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueValues,6);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.OtherBlues,7);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.FamilyBlues,8);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.FamilyOtherBlues,9);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueScale,0xC09,0.039625);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueShift,0xC0A,7);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueFuzz,0xC0B,1);
	
	// StdHW
	mPrimitivesWriter.WriteRealOperand(mType1Input.mPrivateDictionary.StdHW);
	mPrimitivesWriter.WriteDictOperator(0xA);

	// StdVW
	mPrimitivesWriter.WriteRealOperand(mType1Input.mPrivateDictionary.StdVW);
	mPrimitivesWriter.WriteDictOperator(0xB);

	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.StemSnapH,0xC0C);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.StemSnapV,0xC0D);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,(int)(mType1Input.mPrivateDictionary.ForceBold ? 1:0),0xC0E,0);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.LanguageGroup,0xC11,0);

	mPrivateSize = mFontFileStream.GetCurrentPosition() - mPrivatePosition;
	return mPrimitivesWriter.GetInternalState();
}